

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O1

void smix2(uint8_t *B,size_t r,uint32_t N,uint64_t Nloop,yescrypt_flags_t flags,salsa20_blk_t *V,
          uint32_t NROM,salsa20_blk_t *VROM,salsa20_blk_t *XY,pwxform_ctx_t *ctx)

{
  long lVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  salsa20_blk_t *psVar5;
  uint uVar6;
  long lVar7;
  salsa20_blk_t *psVar8;
  ulong uVar9;
  
  if (Nloop != 0) {
    lVar1 = r * 2;
    if (r != 0) {
      lVar4 = 0;
      psVar5 = XY;
      do {
        lVar7 = 0;
        psVar8 = psVar5;
        do {
          psVar8->w[0] = *(uint32_t *)(B + ((ulong)((uint)lVar7 & 0x3c) | lVar4 << 6));
          lVar7 = lVar7 + 0x14;
          psVar8 = (salsa20_blk_t *)(psVar8->w + 1);
        } while (lVar7 != 0x140);
        lVar4 = lVar4 + 1;
        psVar5 = psVar5 + 1;
      } while (lVar4 != lVar1 + (ulong)(lVar1 == 0));
    }
    psVar5 = XY + r * 2;
    uVar6 = N - 1;
    uVar2 = XY[r * 2 + -1].w[0] & uVar6;
    if ((flags & YESCRYPT_RW) == 0 || VROM == (salsa20_blk_t *)0x0) {
      if (VROM == (salsa20_blk_t *)0x0) {
        uVar9 = Nloop >> 1;
        if ((flags & YESCRYPT_RW) == 0) {
          if (ctx == (pwxform_ctx_t *)0x0) {
            do {
              uVar3 = blockmix_salsa8_xor(XY,V + (ulong)uVar2 * lVar1,psVar5,r);
              uVar3 = blockmix_salsa8_xor(psVar5,V + (ulong)(uVar3 & uVar6) * lVar1,XY,r);
              uVar2 = uVar3 & uVar6;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          else {
            do {
              uVar3 = blockmix_xor(XY,V + (ulong)uVar2 * lVar1,psVar5,r,0,ctx);
              uVar3 = blockmix_xor(psVar5,V + (ulong)(uVar3 & uVar6) * lVar1,XY,r,0,ctx);
              uVar2 = uVar3 & uVar6;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
        }
        else {
          do {
            uVar3 = blockmix_xor_save(XY,V + (ulong)uVar2 * lVar1,psVar5,r,ctx);
            uVar3 = blockmix_xor_save(psVar5,V + (ulong)(uVar3 & uVar6) * lVar1,XY,r,ctx);
            uVar2 = uVar3 & uVar6;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
      }
      else {
        uVar9 = 0;
        do {
          uVar3 = blockmix_xor(XY,V + (ulong)uVar2 * lVar1,psVar5,r,0,ctx);
          uVar3 = blockmix_xor(psVar5,VROM + (ulong)(uVar3 & NROM - 1) * lVar1,XY,r,1,ctx);
          uVar2 = uVar3 & uVar6;
          uVar9 = uVar9 + 2;
        } while (uVar9 < Nloop);
      }
    }
    else {
      uVar9 = 0;
      do {
        uVar3 = blockmix_xor_save(XY,V + (ulong)uVar2 * lVar1,psVar5,r,ctx);
        uVar3 = blockmix_xor(psVar5,VROM + (ulong)(uVar3 & NROM - 1) * lVar1,XY,r,1,ctx);
        uVar2 = uVar3 & uVar6;
        uVar9 = uVar9 + 2;
      } while (uVar9 < Nloop);
    }
    if (r != 0) {
      lVar4 = 0;
      do {
        lVar7 = 0;
        psVar5 = XY;
        do {
          *(uint32_t *)(B + ((ulong)((uint)lVar7 & 0x3c) | lVar4 << 6)) = psVar5->w[0];
          lVar7 = lVar7 + 0x14;
          psVar5 = (salsa20_blk_t *)(psVar5->w + 1);
        } while (lVar7 != 0x140);
        lVar4 = lVar4 + 1;
        XY = XY + 1;
      } while (lVar4 != lVar1 + (ulong)(lVar1 == 0));
    }
  }
  return;
}

Assistant:

static void
smix2(uint8_t * B, size_t r, uint32_t N, uint64_t Nloop,
    yescrypt_flags_t flags, salsa20_blk_t * V, uint32_t NROM,
    const salsa20_blk_t * VROM, salsa20_blk_t * XY, pwxform_ctx_t * ctx)
{
	size_t s = 2 * r;
	salsa20_blk_t * X = XY, * Y = &XY[s];
	uint64_t i;
	uint32_t j;
	size_t k;

	if (Nloop == 0)
		return;

	/* X <-- B' */
	/* 3: V_i <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			X[k].w[i] = le32dec(&B[(k * 16 + (i * 5 % 16)) * 4]);
		}
	}

	i = Nloop / 2;

	/* 7: j <-- Integerify(X) mod N */
	j = integerify(X, r) & (N - 1);

/*
 * Normally, VROM implies YESCRYPT_RW, but we check for these separately
 * because our SMix resets YESCRYPT_RW for the smix2() calls operating on the
 * entire V when p > 1.
 */
	if (VROM && (flags & YESCRYPT_RW)) {
		/* 6: for i = 0 to N - 1 do */
		for (i = 0; i < Nloop; i += 2) {
			salsa20_blk_t * V_j = &V[j * s];
			const salsa20_blk_t * VROM_j;

			/* 8: X <-- H(X \xor V_j) */
			/* V_j <-- Xprev \xor V_j */
			/* j <-- Integerify(X) mod NROM */
			j = blockmix_xor_save(X, V_j, Y, r, ctx) & (NROM - 1);
			VROM_j = &VROM[j * s];

			/* X <-- H(X \xor VROM_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor(Y, VROM_j, X, r, 1, ctx) & (N - 1);
			V_j = &V[j * s];
		}
	} else if (VROM) {
		/* 6: for i = 0 to N - 1 do */
		for (i = 0; i < Nloop; i += 2) {
			const salsa20_blk_t * V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* V_j <-- Xprev \xor V_j */
			/* j <-- Integerify(X) mod NROM */
			j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (NROM - 1);
			V_j = &VROM[j * s];

			/* X <-- H(X \xor VROM_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor(Y, V_j, X, r, 1, ctx) & (N - 1);
			V_j = &V[j * s];
		}
	} else if (flags & YESCRYPT_RW) {
		/* 6: for i = 0 to N - 1 do */
		do {
			salsa20_blk_t * V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* V_j <-- Xprev \xor V_j */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor_save(X, V_j, Y, r, ctx) & (N - 1);
			V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* V_j <-- Xprev \xor V_j */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor_save(Y, V_j, X, r, ctx) & (N - 1);
		} while (--i);
	} else if (ctx) {
		/* 6: for i = 0 to N - 1 do */
		do {
			const salsa20_blk_t * V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (N - 1);
			V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_xor(Y, V_j, X, r, 0, ctx) & (N - 1);
		} while (--i);
	} else {
		/* 6: for i = 0 to N - 1 do */
		do {
			const salsa20_blk_t * V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_salsa8_xor(X, V_j, Y, r) & (N - 1);
			V_j = &V[j * s];

			/* 8: X <-- H(X \xor V_j) */
			/* 7: j <-- Integerify(X) mod N */
			j = blockmix_salsa8_xor(Y, V_j, X, r) & (N - 1);
		} while (--i);
	}

	/* 10: B' <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			le32enc(&B[(k * 16 + (i * 5 % 16)) * 4], X[k].w[i]);
		}
	}
}